

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

int __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
best_split_propagation
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                 *traversal_path,bool verbose)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  reference pTVar6;
  byte in_DL;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *in_RSI;
  long *in_RDI;
  double dVar7;
  TraversalNode *tn_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *__range3;
  SplitDecisionCosts *c;
  int i;
  int best_path_level;
  double best_cost;
  double cumulative_cost;
  AlexNode<double,_double> *next;
  double stop_cost;
  TraversalNode *tn;
  const_iterator __end0;
  const_iterator __begin0;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *__range2;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
  traversal_costs;
  value_type *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  ostream *in_stack_fffffffffffffed0;
  double local_e8;
  double local_d8;
  __normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
  local_b8;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *local_b0;
  reference local_a8;
  int local_a0;
  int local_9c;
  double local_98;
  double local_90;
  double local_78;
  double local_70;
  AlexNode<double,_double> *local_68;
  double local_60;
  reference local_58;
  TraversalNode *local_50;
  __normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
  local_48;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *local_40;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
  local_38;
  byte local_19;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *local_18;
  int local_4;
  
  local_19 = in_DL & 1;
  if ((*(byte *)(*in_RDI + 8) & 1) == 0) {
    local_18 = in_RSI;
    std::
    vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
    ::vector((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
              *)0x11d76e);
    local_40 = local_18;
    local_48._M_current =
         (TraversalNode *)
         std::
         vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
         ::begin((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                  *)in_stack_fffffffffffffeb8);
    local_50 = (TraversalNode *)
               std::
               vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
               ::end((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                      *)in_stack_fffffffffffffeb8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
                               *)in_stack_fffffffffffffec0,
                              (__normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
                               *)in_stack_fffffffffffffeb8), bVar2) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
                 ::operator*(&local_48);
      local_68 = local_58->node->children_[local_58->bucketID];
      if (local_68->duplication_factor_ == '\0') {
        if (local_58->node->num_children_ < (int)in_RDI[4]) {
          local_d8 = (double)local_58->node->num_children_ + 8.0;
        }
        else {
          local_d8 = std::numeric_limits<double>::max();
        }
        local_60 = local_d8;
      }
      else {
        local_60 = 0.0;
      }
      local_78 = local_60;
      if (local_58->node->num_children_ < 3) {
        local_e8 = 0.0;
      }
      else {
        local_e8 = (double)(local_58->node->num_children_ / 2) + 8.0;
      }
      local_70 = local_e8;
      std::
      vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
      ::push_back((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
                   *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      __gnu_cxx::
      __normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
      ::operator++(&local_48);
    }
    local_90 = 0.0;
    local_98 = std::numeric_limits<double>::max();
    local_9c = (int)*(short *)(in_RDI[1] + 10);
    sVar3 = std::
            vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
            ::size(&local_38);
    local_a0 = (int)sVar3;
    while (local_a0 = local_a0 + -1, -1 < local_a0) {
      local_a8 = std::
                 vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
                 ::operator[](&local_38,(long)local_a0);
      dVar1 = local_a8->stop_cost;
      dVar7 = std::numeric_limits<double>::max();
      if (((dVar1 != dVar7) || (NAN(dVar1) || NAN(dVar7))) &&
         (local_90 + local_a8->stop_cost < local_98)) {
        local_98 = local_90 + local_a8->stop_cost;
        pvVar4 = std::
                 vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                 ::operator[](local_18,(long)local_a0);
        local_9c = (int)(pvVar4->node->super_AlexNode<double,_double>).level_;
      }
      local_90 = local_a8->split_cost + local_90;
    }
    if ((local_19 & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[Best split propagation] best level: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_9c);
      poVar5 = std::operator<<(poVar5,", parent level: ");
      pvVar4 = std::
               vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
               ::back((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                       *)in_stack_fffffffffffffec0);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(pvVar4->node->super_AlexNode<double,_double>).level_);
      poVar5 = std::operator<<(poVar5,", best cost: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_98);
      std::operator<<(poVar5,", traversal path (level/addr/n_children): ");
      local_b0 = local_18;
      local_b8._M_current =
           (TraversalNode *)
           std::
           vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
           ::begin((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                    *)in_stack_fffffffffffffeb8);
      std::
      vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
      ::end((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             *)in_stack_fffffffffffffeb8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
                                 *)in_stack_fffffffffffffec0,
                                (__normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
                                 *)in_stack_fffffffffffffeb8), bVar2) {
        pTVar6 = __gnu_cxx::
                 __normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
                 ::operator*(&local_b8);
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (pTVar6->node->super_AlexNode<double,_double>).level_);
        in_stack_fffffffffffffed0 = std::operator<<(poVar5,"/");
        poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffed0,pTVar6->node);
        in_stack_fffffffffffffec0 = std::operator<<(poVar5,"/");
        in_stack_fffffffffffffeb8 =
             (value_type *)
             std::ostream::operator<<(in_stack_fffffffffffffec0,pTVar6->node->num_children_);
        std::operator<<((ostream *)in_stack_fffffffffffffeb8," ");
        __gnu_cxx::
        __normal_iterator<const_alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode_*,_std::vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>_>
        ::operator++(&local_b8);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    local_4 = local_9c;
    std::
    vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
    ::~vector((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
               *)in_stack_fffffffffffffed0);
  }
  else {
    local_4 = (int)*(short *)(in_RDI[1] + 10);
  }
  return local_4;
}

Assistant:

int best_split_propagation(const std::vector<TraversalNode>& traversal_path,
                             bool verbose = false) const {
    if (root_node_->is_leaf_) {
      return superroot_->level_;
    }

    // Find costs on the path down to data node
    std::vector<SplitDecisionCosts> traversal_costs;
    for (const TraversalNode& tn : traversal_path) {
      double stop_cost;
      AlexNode<T, P>* next = tn.node->children_[tn.bucketID];
      if (next->duplication_factor_ > 0) {
        stop_cost = 0;
      } else {
        stop_cost =
            tn.node->num_children_ >= derived_params_.max_fanout
                ? std::numeric_limits<double>::max()
                : tn.node->num_children_ + SplitDecisionCosts::base_cost;
      }
      traversal_costs.push_back(
          {stop_cost,
           tn.node->num_children_ <= 2
               ? 0
               : tn.node->num_children_ / 2 + SplitDecisionCosts::base_cost});
    }

    // Compute back upwards to find the optimal node to stop propagation.
    // Ignore the superroot (the first node in the traversal path).
    double cumulative_cost = 0;
    double best_cost = std::numeric_limits<double>::max();
    int best_path_level = superroot_->level_;
    for (int i = traversal_costs.size() - 1; i >= 0; i--) {
      SplitDecisionCosts& c = traversal_costs[i];
      if (c.stop_cost != std::numeric_limits<double>::max() &&
          cumulative_cost + c.stop_cost < best_cost) {
        best_cost = cumulative_cost + c.stop_cost;
        best_path_level = traversal_path[i].node->level_;
      }
      cumulative_cost += c.split_cost;
    }

    if (verbose) {
      std::cout << "[Best split propagation] best level: " << best_path_level
                << ", parent level: " << traversal_path.back().node->level_
                << ", best cost: " << best_cost
                << ", traversal path (level/addr/n_children): ";
      for (const TraversalNode& tn : traversal_path) {
        std::cout << tn.node->level_ << "/" << tn.node << "/"
                  << tn.node->num_children_ << " ";
      }
      std::cout << std::endl;
    }
    return best_path_level;
  }